

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O2

void __thiscall efsw::FileWatcherGeneric::watch(FileWatcherGeneric *this)

{
  Thread *this_00;
  
  if (this->mThread != (Thread *)0x0) {
    return;
  }
  this_00 = (Thread *)operator_new(0x18);
  Thread::Thread<efsw::FileWatcherGeneric>
            (this_00,(offset_in_FileWatcherGeneric_to_subr)run,(FileWatcherGeneric *)0x0);
  this->mThread = this_00;
  (*this_00->_vptr_Thread[2])(this_00);
  return;
}

Assistant:

void FileWatcherGeneric::watch() {
	if ( NULL == mThread ) {
		mThread = new Thread( &FileWatcherGeneric::run, this );
		mThread->launch();
	}
}